

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O1

void Sbl_ManClean(Sbl_Man_t *p)

{
  byte bVar1;
  int iVar2;
  sat_solver *psVar3;
  int **ppiVar4;
  Vec_Wec_t *pVVar5;
  Vec_Int_t *pVVar6;
  int iVar7;
  long lVar8;
  timespec ts;
  timespec local_18;
  
  iVar7 = clock_gettime(3,&local_18);
  if (iVar7 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_18.tv_nsec / 1000 + local_18.tv_sec * 1000000;
  }
  p->timeStart = lVar8;
  sat_solver_rollback(p->pSat);
  psVar3 = p->pSat;
  if (psVar3->qhead == psVar3->qtail) {
    iVar7 = psVar3->size;
    psVar3->iVarPivot = iVar7;
    psVar3->iTrailPivot = psVar3->qhead;
    *(undefined8 *)(psVar3->Mem).BookMarkE = *(undefined8 *)(psVar3->Mem).nEntries;
    iVar2 = (psVar3->Mem).iPage[0];
    bVar1 = (byte)(psVar3->Mem).nPageSize;
    ppiVar4 = (psVar3->Mem).pPages;
    (psVar3->Mem).BookMarkH[0] = iVar2 << (bVar1 & 0x1f) | *ppiVar4[iVar2];
    iVar2 = (psVar3->Mem).iPage[1];
    (psVar3->Mem).BookMarkH[1] = iVar2 << (bVar1 & 0x1f) | *ppiVar4[iVar2];
    if (psVar3->activity2 != (word *)0x0) {
      psVar3->var_inc2 = psVar3->var_inc;
      memcpy(psVar3->activity2,psVar3->activity,(long)iVar7 << 3);
    }
    p->vLeaves->nSize = 0;
    p->vAnds->nSize = 0;
    p->vNodes->nSize = 0;
    p->vRoots->nSize = 0;
    p->vRootVars->nSize = 0;
    p->vArrs->nSize = 0;
    p->vReqs->nSize = 0;
    pVVar5 = p->vWindow;
    iVar7 = pVVar5->nSize;
    if (0 < (long)iVar7) {
      pVVar6 = pVVar5->pArray;
      lVar8 = 0;
      do {
        *(undefined4 *)((long)&pVVar6->nSize + lVar8) = 0;
        lVar8 = lVar8 + 0x10;
      } while ((long)iVar7 * 0x10 != lVar8);
    }
    pVVar5->nSize = 0;
    p->vPath->nSize = 0;
    p->vEdges->nSize = 0;
    p->vCutsI1->nSize = 0;
    p->vCutsI2->nSize = 0;
    p->vCutsN1->nSize = 0;
    p->vCutsN2->nSize = 0;
    p->vCutsNum->nSize = 0;
    p->vCutsStart->nSize = 0;
    p->vCutsObj->nSize = 0;
    p->vSolInit->nSize = 0;
    p->vSolCur->nSize = 0;
    p->vSolBest->nSize = 0;
    p->vTempI1->nSize = 0;
    p->vTempI2->nSize = 0;
    p->vTempN1->nSize = 0;
    p->vTempN2->nSize = 0;
    p->vLits->nSize = 0;
    p->vAssump->nSize = 0;
    p->vPolar->nSize = 0;
    Gia_ManFillValue(p->pGia);
    return;
  }
  __assert_fail("s->qhead == s->qtail",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                ,0x137,"void sat_solver_bookmark(sat_solver *)");
}

Assistant:

void Sbl_ManClean( Sbl_Man_t * p )
{
    p->timeStart = Abc_Clock();
    sat_solver_rollback( p->pSat );
    sat_solver_bookmark( p->pSat );
    // internal
    Vec_IntClear( p->vLeaves );
    Vec_IntClear( p->vAnds );
    Vec_IntClear( p->vNodes );
    Vec_IntClear( p->vRoots );
    Vec_IntClear( p->vRootVars );
    // timing
    Vec_IntClear( p->vArrs );
    Vec_IntClear( p->vReqs );
    Vec_WecClear( p->vWindow );
    Vec_IntClear( p->vPath );
    Vec_IntClear( p->vEdges );
    // cuts
    Vec_WrdClear( p->vCutsI1 );
    Vec_WrdClear( p->vCutsI2 );
    Vec_WrdClear( p->vCutsN1 );
    Vec_WrdClear( p->vCutsN2 );
    Vec_IntClear( p->vCutsNum );
    Vec_IntClear( p->vCutsStart );
    Vec_IntClear( p->vCutsObj );
    Vec_IntClear( p->vSolInit );
    Vec_IntClear( p->vSolCur );
    Vec_IntClear( p->vSolBest );
    Vec_WrdClear( p->vTempI1 );
    Vec_WrdClear( p->vTempI2 );
    Vec_WrdClear( p->vTempN1 );
    Vec_WrdClear( p->vTempN2 );
    // temporary
    Vec_IntClear( p->vLits );
    Vec_IntClear( p->vAssump );
    Vec_IntClear( p->vPolar );
    // other
    Gia_ManFillValue( p->pGia );
}